

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moveGeneration.cpp
# Opt level: O2

void possibleMovesRooks(U64 rBoard,U64 FriendlyPieces,U64 EnemyPieces,castleBools castleInfo,
                       bool black,arrayMoveList *possibleMoves)

{
  long lVar1;
  byte end;
  U64 UVar2;
  U64 UVar3;
  U64 UVar4;
  U64 UVar5;
  ulong occupied;
  uint square;
  byte start;
  ulong uVar6;
  
  occupied = EnemyPieces | FriendlyPieces;
  for (; rBoard != 0; rBoard = rBoard & rBoard - 1) {
    lVar1 = 0;
    if (rBoard != 0) {
      for (; (rBoard >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    square = (uint)lVar1 ^ 0x3f;
    UVar2 = getNegativeRayAttacks(occupied,FriendlyPieces,0,square);
    UVar3 = getNegativeRayAttacks(occupied,FriendlyPieces,3,square);
    UVar4 = getPositiveRayAttacks(occupied,FriendlyPieces,4,square);
    UVar5 = getPositiveRayAttacks(occupied,FriendlyPieces,5,square);
    for (uVar6 = UVar5 | UVar4 | UVar3 | UVar2; uVar6 != 0; uVar6 = uVar6 & uVar6 - 1) {
      lVar1 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      arrayMoveList::create(possibleMoves,(byte)square,(byte)lVar1 ^ 0x3f);
    }
  }
  if (black) {
    if ((occupied & 0x7000000000000000) == 0 && ((uint)castleInfo >> 0x10 & 1) != 0) {
      arrayMoveList::create(possibleMoves,'\x04','\x02','\x01');
    }
    if ((occupied & 0x600000000000000) != 0 || ((uint)castleInfo >> 0x18 & 1) == 0) {
      return;
    }
    start = '\x04';
    end = '\x06';
  }
  else {
    if ((occupied & 0x70) == 0 && (~castleInfo.whiteACan & 1U) == 0) {
      arrayMoveList::create(possibleMoves,'<',':','\x01');
    }
    if ((occupied & 6) != 0 || ((uint)castleInfo >> 8 & 1) == 0) {
      return;
    }
    start = '<';
    end = '>';
  }
  arrayMoveList::create(possibleMoves,start,end,'\x01');
  return;
}

Assistant:

void possibleMovesRooks(const U64 rBoard, const U64 FriendlyPieces, const U64 EnemyPieces, castleBools castleInfo, bool black, arrayMoveList& possibleMoves) {
  U64 pieces = rBoard;

  const U64 occupied = FriendlyPieces | EnemyPieces;

  while(pieces) {
    int square = bitPop(pieces);
    U64 attacks = 0ULL;

    attacks |= getNegativeRayAttacks(occupied, FriendlyPieces, 0, square);
    attacks |= getNegativeRayAttacks(occupied, FriendlyPieces, 3, square);
    attacks |= getPositiveRayAttacks(occupied, FriendlyPieces, 4, square);
    attacks |= getPositiveRayAttacks(occupied, FriendlyPieces, 5, square);

    while(attacks) {
      int j = bitPop(attacks);
      possibleMoves.create(square, j);
    }
  }

	if(black) {
		if(castleInfo.blackACan) {
			if(!(8070450532247928832ULL & (FriendlyPieces | EnemyPieces) )) // Checks for pieces between the rook and king
				possibleMoves.create(4, 2, 1);
		}
		if(castleInfo.blackHCan) {
			if(!(432345564227567616ULL & (FriendlyPieces | EnemyPieces) ))
				possibleMoves.create(4, 6, 1);
		}
	} else {
		if(castleInfo.whiteACan) {
			if(!(112ULL & (FriendlyPieces | EnemyPieces) ))
				possibleMoves.create(60, 58, 1);
		}
		if(castleInfo.whiteHCan) {
			if(!(6ULL & (FriendlyPieces | EnemyPieces) ))
				possibleMoves.create(60, 62, 1);
		}
	}
}